

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O1

char * apprun_string_remove_trailing_new_line(char *str)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    iVar3 = (int)sVar1;
    if (iVar3 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = iVar3 - (uint)(str[iVar3 - 1] == '\n');
    }
    __dest = calloc((ulong)(uVar4 + 1),1);
    pcVar2 = (char *)memcpy(__dest,str,(ulong)uVar4);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *apprun_string_remove_trailing_new_line(const char *str) {
    if (str == NULL)
        return NULL;

    unsigned line_len = strlen(str);
    if (line_len > 0 && str[line_len - 1] == '\n')
        line_len--;

    char *new = calloc(line_len + 1, sizeof(char));
    memcpy(new, str, line_len);
    return new;
}